

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateUpsampleLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  int iVar1;
  int iVar2;
  bool bVar3;
  UpsampleLayerParams *pUVar4;
  Result *_result;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    return __return_storage_ptr__;
  }
  this_00 = &__return_storage_ptr__->m_message;
  std::__cxx11::string::~string((string *)this_00);
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar3 = Result::good(__return_storage_ptr__);
  if (!bVar3) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  if (this->ndArrayInterpretation == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"Upsample",(allocator<char> *)&err);
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_60,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&local_60);
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"Upsample",(allocator<char> *)&local_100);
    validateRankCount(__return_storage_ptr__,layer,&err,3,-1,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&err);
    bVar3 = Result::good(__return_storage_ptr__);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  pUVar4 = Specification::NeuralNetworkLayer::upsample(layer);
  iVar1 = (pUVar4->scalingfactor_).current_size_;
  iVar2 = (pUVar4->fractionalscalingfactor_).current_size_;
  if (iVar1 == 0) {
    if (iVar2 == 0) goto LAB_0027a4ed;
    if (iVar2 != 2) goto LAB_0027a54e;
    if ((pUVar4->mode_ == 0) || (pUVar4->linearupsamplemode_ == 0)) {
      std::operator+(&local_100,"Invalid upsample layer \'",(layer->name_).ptr_);
      std::operator+(&err,&local_100,
                     "\'. Fractional upsample only compatible with align_corners=true or align_corners=false"
                    );
      std::__cxx11::string::~string((string *)&local_100);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      goto LAB_0027a638;
    }
LAB_0027a644:
    Result::Result(__return_storage_ptr__);
  }
  else {
    if (iVar1 == 2 && iVar2 == 0) {
LAB_0027a4ed:
      if ((pUVar4->linearupsamplemode_ == 0) || (pUVar4->mode_ != 0)) goto LAB_0027a644;
      std::operator+(&local_100,"Layer \'",(layer->name_).ptr_);
      std::operator+(&err,&local_100,
                     "\' of type Upsample uses Nearest Neighbors but uses linear upsampling mode other than DEFAULT."
                    );
      std::__cxx11::string::~string((string *)&local_100);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else {
LAB_0027a54e:
      std::operator+(&local_40,"Invalid scaling factor in upsampling layer \'",(layer->name_).ptr_);
      std::operator+(&local_a0,&local_40,
                     "\'. Only one of scalingFactor and fractionalScalingFactor can be set, and if set, must be of size 2. Found scalingFactor of size "
                    );
      std::__cxx11::to_string(&local_c0,(pUVar4->scalingfactor_).current_size_);
      std::operator+(&local_80,&local_a0,&local_c0);
      std::operator+(&local_100,&local_80," and fractionalScalingFactor of size ");
      std::__cxx11::to_string(&local_e0,(pUVar4->fractionalscalingfactor_).current_size_);
      std::operator+(&err,&local_100,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_40);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
LAB_0027a638:
    std::__cxx11::string::~string((string *)&err);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateUpsampleLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Upsample", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Upsample", 3, -1, blobNameToRank));
    }

    const auto& params = layer.upsample();
    /* If scalingFactor or fractionalScalingFactor are provided, they must be mutually exclusive and of size 2.
                             scalingFactor
                             0 | 2 | Other
                      0      V   V   I
       fractionalSF   2      V   I   I
                      Other  I   I   I
     */
    bool validScalingFactors;
    if (params.scalingfactor_size() == 0) {
        validScalingFactors = params.fractionalscalingfactor_size() == 0 || params.fractionalscalingfactor_size() == 2;
    } else {
        validScalingFactors = params.fractionalscalingfactor_size() == 0 && params.scalingfactor_size() == 2;
    }
    if (!validScalingFactors) {
        std::string err = "Invalid scaling factor in upsampling layer '" + layer.name()
            + "'. Only one of scalingFactor and fractionalScalingFactor can be set, and if set, must be of size 2. Found scalingFactor of size "
            + std::to_string(params.scalingfactor_size()) + " and fractionalScalingFactor of size " + std::to_string(params.fractionalscalingfactor_size());
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.fractionalscalingfactor_size() == 2
        && (params.mode() == Specification::UpsampleLayerParams_InterpolationMode_NN
            || params.linearupsamplemode() == Specification::UpsampleLayerParams_LinearUpsampleMode_DEFAULT)) {
        std::string err = "Invalid upsample layer '" + layer.name() + "'. Fractional upsample only compatible with align_corners=true or align_corners=false";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if(params.linearupsamplemode() != Specification::UpsampleLayerParams_LinearUpsampleMode_DEFAULT
       && params.mode() == Specification::UpsampleLayerParams_InterpolationMode_NN) {
        std::string err = "Layer '" + layer.name() + "' of type Upsample uses Nearest Neighbors but uses linear upsampling mode other than DEFAULT.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return Result();
}